

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O1

unsigned_long_long __thiscall argagg::option_results::as<unsigned_long_long>(option_results *this)

{
  pointer poVar1;
  unsigned_long_long uVar2;
  out_of_range *this_00;
  
  poVar1 = (this->all).
           super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (poVar1 != (this->all).
                super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
                _M_impl.super__Vector_impl_data._M_start) {
    uVar2 = option_result::as<unsigned_long_long>(poVar1 + -1);
    return uVar2;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"no option arguments to convert");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

T option_results::as() const
{
  if (this->all.size() == 0) {
    throw std::out_of_range("no option arguments to convert");
  }
  return this->all.back().as<T>();
}